

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O3

JSON_Status json_object_clear(JSON_Object *object)

{
  size_t *psVar1;
  ulong uVar2;
  
  if (object == (JSON_Object *)0x0) {
    return -1;
  }
  if (object->count != 0) {
    uVar2 = 0;
    do {
      (*parson_free)(object->names[uVar2]);
      object->names[uVar2] = (char *)0x0;
      json_value_free(object->values[uVar2]);
      object->values[uVar2] = (JSON_Value *)0x0;
      uVar2 = uVar2 + 1;
    } while (uVar2 < object->count);
  }
  object->count = 0;
  if (object->cell_capacity != 0) {
    psVar1 = object->cells;
    uVar2 = 0;
    do {
      psVar1[uVar2] = 0xffffffffffffffff;
      uVar2 = uVar2 + 1;
    } while (uVar2 < object->cell_capacity);
  }
  return 0;
}

Assistant:

JSON_Status json_object_clear(JSON_Object *object) {
    size_t i = 0;
    if (object == NULL) {
        return JSONFailure;
    }
    for (i = 0; i < json_object_get_count(object); i++) {
        parson_free(object->names[i]);
        object->names[i] = NULL;
        
        json_value_free(object->values[i]);
        object->values[i] = NULL;
    }
    object->count = 0;
    for (i = 0; i < object->cell_capacity; i++) {
        object->cells[i] = OBJECT_INVALID_IX;
    }
    return JSONSuccess;
}